

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

Var Js::JavascriptFunction::EntryCall(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *this;
  JavascriptMethod entryPoint;
  uint uVar7;
  ulong uVar8;
  uint in_stack_00000010;
  Arguments local_40;
  undefined1 auStack_30 [8];
  Arguments args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  uVar7 = callInfo._0_4_;
  if (in_stack_00000010 != uVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x27c,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00bc5d18;
    *puVar5 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  auStack_30 = (undefined1  [8])callInfo;
  if ((uVar7 >> 0x18 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptFunction.cpp"
                                ,0x27f,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) {
LAB_00bc5d18:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if (((ulong)callInfo & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)auStack_30,0);
    bVar4 = JavascriptConversion::IsCallable(pvVar6);
    if (bVar4) {
      pvVar6 = Arguments::operator[]((Arguments *)auStack_30,0);
      this = VarTo<Js::RecyclableObject>(pvVar6);
      if ((uVar7 & 0xffffff) == 1) {
        *(RecyclableObject **)args.Info =
             (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
      }
      else {
        if ((auStack_30._0_4_ & 0xffffff) == 1) {
          uVar7 = 0;
        }
        else {
          uVar8 = 0;
          do {
            *(undefined8 *)((long)args.Info + uVar8 * 8) =
                 *(undefined8 *)((long)args.Info + 8 + uVar8 * 8);
            uVar8 = uVar8 + 1;
            uVar7 = (auStack_30._0_4_ & 0xffffff) - 1;
          } while (uVar8 < uVar7);
          uVar7 = uVar7 & 0xffffff;
        }
        auStack_30 = (undefined1  [8])((ulong)auStack_30 & 0xffffffffff000000 | (ulong)uVar7);
      }
      pTVar2 = pSVar1->threadContext;
      bVar4 = pTVar2->reentrancySafeOrHandled;
      pTVar2->reentrancySafeOrHandled = true;
      entryPoint = RecyclableObject::GetEntryPoint(this);
      local_40.Info = (Type)auStack_30;
      local_40.Values = (Type)args.Info;
      pvVar6 = CallFunction<true>(this,entryPoint,&local_40,true);
      pTVar2->reentrancySafeOrHandled = bVar4;
      return pvVar6;
    }
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec40,L"Function.prototype.call");
}

Assistant:

Var JavascriptFunction::EntryCall(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        RUNTIME_ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        ///
        /// Check Argument[0] has internal [[Call]] property
        /// If not, throw TypeError
        ///
        uint argCount = args.Info.Count;
        if (argCount == 0 || !JavascriptConversion::IsCallable(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("Function.prototype.call"));
        }

        RecyclableObject *pFunc = VarTo<RecyclableObject>(args[0]);
        if (argCount == 1)
        {
            args.Values[0] = scriptContext->GetLibrary()->GetUndefined();
        }
        else
        {
            ///
            /// Remove function object from the arguments and pass the rest
            ///
            for (uint i = 0; i < args.Info.Count - 1; ++i)
            {
                args.Values[i] = args.Values[i + 1];
            }
            args.Info.Count = args.Info.Count - 1;
        }

        ///
        /// Call the [[Call]] method on the function object
        ///
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return JavascriptFunction::CallFunction<true>(pFunc, pFunc->GetEntryPoint(), args, true /*useLargeArgCount*/);
        }
        END_SAFE_REENTRANT_CALL
    }